

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

el_status_t transpose(void)

{
  uchar c_00;
  long lVar1;
  char c;
  
  if (rl_point != 0) {
    if (rl_point == rl_end) {
      left(CSmove);
    }
    c_00 = rl_line_buffer[rl_point + -1];
    left(CSstay);
    rl_line_buffer[rl_point + -1] = rl_line_buffer[rl_point];
    tty_show(rl_line_buffer[rl_point + -1]);
    lVar1 = (long)rl_point;
    rl_point = rl_point + 1;
    rl_line_buffer[lVar1] = c_00;
    tty_show(c_00);
  }
  return CSstay;
}

Assistant:

static el_status_t transpose(void)
{
    char        c;

    if (rl_point) {
        if (rl_point == rl_end)
            left(CSmove);
        c = rl_line_buffer[rl_point - 1];
        left(CSstay);
        rl_line_buffer[rl_point - 1] = rl_line_buffer[rl_point];
        tty_show(rl_line_buffer[rl_point - 1]);
        rl_line_buffer[rl_point++] = c;
        tty_show(c);
    }

    return CSstay;
}